

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall GlobalMemoryAccountant::restoreMemoryAllocators(GlobalMemoryAccountant *this)

{
  if (currentMallocAllocator == (TestMemoryAllocator *)0x0) {
    defaultMallocAllocator();
    currentMallocAllocator = &defaultMallocAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentMallocAllocator == this->mallocAllocator_) {
    currentMallocAllocator = this->mallocAllocator_->originalAllocator_;
  }
  if (currentNewAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewAllocator();
    currentNewAllocator = &defaultNewAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentNewAllocator == this->newAllocator_) {
    currentNewAllocator = this->newAllocator_->originalAllocator_;
  }
  if (currentNewArrayAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewArrayAllocator();
    currentNewArrayAllocator = &defaultNewArrayAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentNewArrayAllocator == this->newArrayAllocator_) {
    currentNewArrayAllocator = this->newArrayAllocator_->originalAllocator_;
  }
  return;
}

Assistant:

void GlobalMemoryAccountant::restoreMemoryAllocators()
{
    if (getCurrentMallocAllocator() == mallocAllocator_)
        setCurrentMallocAllocator(mallocAllocator_->originalAllocator());

    if (getCurrentNewAllocator() == newAllocator_)
        setCurrentNewAllocator(newAllocator_->originalAllocator());

    if (getCurrentNewArrayAllocator() == newArrayAllocator_)
        setCurrentNewArrayAllocator(newArrayAllocator_->originalAllocator());
}